

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

Token * __thiscall Tokenizer::getNextHeaderToken(Token *__return_storage_ptr__,Tokenizer *this)

{
  char *pcVar1;
  pointer pcVar2;
  size_type sVar3;
  _Storage<char,_true> c;
  _Optional_base<char,_true,_true> _Var4;
  optional<char> oVar5;
  int iVar6;
  TokenizerException *pTVar7;
  size_type sVar8;
  allocator<char> local_81;
  string local_80;
  string *local_60;
  _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_58;
  
  _Var4._M_payload.super__Optional_payload_base<char> =
       (_Optional_payload<char,_true,_true,_true>)next(this);
  if (((ushort)_Var4._M_payload.super__Optional_payload_base<char> >> 8 & 1) == 0) {
    pTVar7 = (TokenizerException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"Unexpected EOF while parsing HeaderBlock",&local_81);
    TokenizerException::TokenizerException
              (pTVar7,&local_80,this->line_number,this->col_number,&this->current_line);
    __cxa_throw(pTVar7,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
  }
  while( true ) {
    c._M_value = _Var4._M_payload.super__Optional_payload_base<char>._M_payload;
    iVar6 = isspace((int)c._M_value);
    if (iVar6 == 0) break;
    _Var4._M_payload.super__Optional_payload_base<char> =
         (_Optional_payload<char,_true,_true,_true>)next(this);
    if (((ushort)_Var4._M_payload.super__Optional_payload_base<char> >> 8 & 1) == 0) {
      pTVar7 = (TokenizerException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"Unexpected EOF while parsing HeaderBlock",&local_81);
      TokenizerException::TokenizerException
                (pTVar7,&local_80,this->line_number,this->col_number,&this->current_line);
      __cxa_throw(pTVar7,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if (c._M_value == ':') {
    if ((this->program)._M_string_length <= (ulong)(long)this->pos) {
      pTVar7 = (TokenizerException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"Unexpected EOF while parsing HeaderBlock",&local_81);
      TokenizerException::TokenizerException
                (pTVar7,&local_80,this->line_number,this->col_number,&this->current_line);
      __cxa_throw(pTVar7,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((this->program)._M_dataplus._M_p[this->pos] != ':') {
      __return_storage_ptr__->type = Colon;
      *(undefined4 *)
       &(__return_storage_ptr__->value).
        super__Variant_base<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
        .super__Move_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
        super__Copy_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
        super__Move_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
        super__Copy_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
        super__Variant_storage_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>._M_u
           = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->value).
               super__Variant_base<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
               .super__Move_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
               super__Copy_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
               super__Move_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
               super__Copy_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
               super__Variant_storage_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>
       + 0x20) = '\0';
      return __return_storage_ptr__;
    }
    next(this);
  }
  else if (((ushort)_Var4._M_payload.super__Optional_payload_base<char> & 0xff) == 0x5d) {
    if ((this->program)._M_string_length <= (ulong)(long)this->pos) {
      pTVar7 = (TokenizerException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"Unexpected EOF while parsing HeaderBlock",&local_81);
      TokenizerException::TokenizerException
                (pTVar7,&local_80,this->line_number,this->col_number,&this->current_line);
      __cxa_throw(pTVar7,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((this->program)._M_dataplus._M_p[this->pos] == ']') {
      local_60 = &this->header_block_name;
      pcVar2 = (this->header_block_name)._M_dataplus._M_p;
      sVar3 = (this->header_block_name)._M_string_length;
      sVar8 = 0;
      do {
        if (sVar3 == sVar8) {
          next(this,(int)sVar3 + 1);
          this->parsingHeaderBlock = false;
          std::__detail::__variant::
          _Variant_storage<false,int,double,std::__cxx11::string,bool,char>::
          _Variant_storage<2ul,std::__cxx11::string&>
                    ((_Variant_storage<false,int,double,std::__cxx11::string,bool,char> *)&local_58,
                     local_60);
          __return_storage_ptr__->type = HeaderCloser;
          std::__detail::__variant::
          _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
          ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                             *)&__return_storage_ptr__->value,
                            (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                             *)&local_58);
          std::__detail::__variant::
          _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
          ::~_Variant_storage(&local_58);
          return __return_storage_ptr__;
        }
        oVar5 = peek(this,(int)sVar8 + 1);
        if (((ushort)oVar5.super__Optional_base<char,_true,_true>._M_payload.
                     super__Optional_payload_base<char> >> 8 & 1) == 0) {
          pTVar7 = (TokenizerException *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_80,"Unexpected EOF while parsing HeaderBlock",&local_81);
          TokenizerException::TokenizerException
                    (pTVar7,&local_80,this->line_number,this->col_number,&this->current_line);
          __cxa_throw(pTVar7,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
        }
        pcVar1 = pcVar2 + sVar8;
        sVar8 = sVar8 + 1;
      } while (*pcVar1 ==
               oVar5.super__Optional_base<char,_true,_true>._M_payload.
               super__Optional_payload_base<char>._M_payload);
    }
  }
  if ((this->currentToken).type == Colon) {
    parseHeaderValue(__return_storage_ptr__,this,c._M_value);
  }
  else {
    parseHeaderKey(__return_storage_ptr__,this,c._M_value);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Tokenizer::getNextHeaderToken() {
    char c;
    optional<char> _;
    // Get next char of program
    _ = next();
    if (!_.has_value()) {
        throw TokenizerException("Unexpected EOF while parsing HeaderBlock", line_number, col_number, current_line);
    }
    c = _.value();

    // Ignore whitespace
    while (isspace(c)) {
        _ = next();
        if (!_.has_value()) {
            throw TokenizerException("Unexpected EOF while parsing HeaderBlock", line_number, col_number, current_line);
        }
        c = _.value();
    }

    if (c == ']') {
        _ = peek();
        if (!_.has_value()) {
            throw TokenizerException("Unexpected EOF while parsing HeaderBlock", line_number, col_number, current_line);
        } else if (_.value() == ']') {
            int i;
            bool matches = true;
            for (i = 0; i < header_block_name.length(); i++) {
                _ = peek(1 + i);
                if (!_.has_value()) {
                    throw TokenizerException("Unexpected EOF while parsing HeaderBlock", line_number, col_number,
                                             current_line);
                }
                if (_.value() != header_block_name[i]) {
                    matches = false;
                    break;
                }
            }
            if (matches) {
                next(1 + i);
                parsingHeaderBlock = false;
                return Token(HeaderCloser, header_block_name);
            }
        }
    }
    if (c == ':') {
        _ = peek();
        if (!_.has_value())
            throw TokenizerException("Unexpected EOF while parsing HeaderBlock", line_number, col_number, current_line);
        if (_.value() != ':') {
            return Token(Colon);
        } else {
            next();
        }
    }
    if (currentToken.type == Colon) {
        return parseHeaderValue(c);
    } else {
        return parseHeaderKey(c);
    }
}